

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

Expression * __thiscall
wasm::OptimizeInstructions::optimizeRelational(OptimizeInstructions *this,Binary *curr)

{
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  matcher;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  matcher_00;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  matcher_01;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  matcher_02;
  Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  matcher_03;
  Const *binary;
  Type TVar1;
  bool bVar2;
  BinaryOp BVar3;
  BinaryOp BVar4;
  Index IVar5;
  Index IVar6;
  OptimizeInstructions *pOVar7;
  int64_t iVar8;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  *s2;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  *pMVar9;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  *in_R9;
  byte local_7da;
  byte local_741;
  bool local_729;
  Type local_700;
  Literal local_6f8;
  uintptr_t local_6e0;
  uintptr_t local_6d8;
  Type local_6d0;
  Literal local_6c8;
  uintptr_t local_6b0;
  uintptr_t local_6a8;
  Type local_6a0;
  Literal local_698;
  uintptr_t local_680;
  uintptr_t local_678;
  uintptr_t local_670;
  uintptr_t local_668;
  uintptr_t local_660;
  Type local_658;
  Literal local_650;
  uintptr_t local_638;
  uintptr_t local_630;
  uintptr_t local_628;
  uintptr_t local_620;
  uintptr_t local_618;
  uintptr_t local_610;
  byte local_605;
  uint local_604;
  bool rightIsNegative;
  Type TStack_600;
  Index rightMinBits;
  Type local_5f8;
  Type type_1;
  Index leftMaxBits;
  Literal local_5e0;
  Literal local_5c8;
  byte local_5a9;
  Literal local_5a8;
  Literal local_590;
  byte local_571;
  Literal local_570;
  Literal local_558;
  byte local_539;
  Literal local_538;
  Literal local_520;
  byte local_502;
  byte local_501;
  bool doC2SubC1;
  Type TStack_500;
  bool doC1SubC2;
  undefined1 local_4f8 [8];
  Literal zero;
  Literal C2SubC1;
  Literal C1SubC2;
  undefined1 local_4a0 [8];
  Literal C2;
  Literal C1;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  local_430;
  undefined1 local_3f0 [16];
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  local_3e0;
  Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  local_3b8;
  Const *local_380;
  Const *c2;
  Const *c1;
  Binary *add;
  undefined1 local_320 [72];
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  local_2d8;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  local_2b0;
  undefined1 local_268 [72];
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  local_220;
  uintptr_t local_1f8;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  local_1f0;
  undefined1 local_1a8 [72];
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  local_160;
  uintptr_t local_138;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  local_130;
  undefined1 local_e8 [72];
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  local_a0;
  long local_78;
  Binary *inner;
  Const *rightConst_1;
  Binary *local_60;
  Binary *rightBinary;
  Const *rightConst;
  Const *leftConst;
  Binary *local_40;
  Binary *left;
  uintptr_t local_30;
  Type local_28;
  Type type;
  Binary *curr_local;
  OptimizeInstructions *this_local;
  
  local_28.id = (curr->right->type).id;
  type.id = (uintptr_t)curr;
  bVar2 = wasm::Type::isInteger(&curr->left->type);
  if (!bVar2) {
    return (Expression *)(OptimizeInstructions *)0x0;
  }
  BVar4 = *(BinaryOp *)(type.id + 0x10);
  local_30 = local_28.id;
  BVar3 = Abstract::getBinary(local_28,Eq);
  if (BVar4 == BVar3) {
LAB_01f8b40a:
    local_40 = Expression::dynCast<wasm::Binary>(*(Expression **)(type.id + 0x18));
    if (local_40 != (Binary *)0x0) {
      BVar4 = local_40->op;
      leftConst = (Const *)local_28.id;
      BVar3 = Abstract::getBinary(local_28,Add);
      if ((BVar4 == BVar3) &&
         (rightConst = Expression::dynCast<wasm::Const>(local_40->right), rightConst != (Const *)0x0
         )) {
        rightBinary = (Binary *)Expression::dynCast<wasm::Const>(*(Expression **)(type.id + 0x20));
        if (rightBinary != (Binary *)0x0) {
          pOVar7 = (OptimizeInstructions *)
                   combineRelationalConstants
                             (this,(Binary *)type.id,local_40,rightConst,(Binary *)0x0,
                              (Const *)rightBinary);
          return (Expression *)pOVar7;
        }
        local_60 = Expression::dynCast<wasm::Binary>(*(Expression **)(type.id + 0x20));
        if (local_60 != (Binary *)0x0) {
          BVar4 = local_60->op;
          rightConst_1 = (Const *)local_28.id;
          BVar3 = Abstract::getBinary(local_28,Add);
          if (BVar4 == BVar3) {
            inner = (Binary *)Expression::dynCast<wasm::Const>(local_60->right);
            if (inner != (Binary *)0x0) {
              pOVar7 = (OptimizeInstructions *)
                       combineRelationalConstants
                                 (this,(Binary *)type.id,local_40,rightConst,local_60,(Const *)inner
                                 );
              return (Expression *)pOVar7;
            }
            inner = (Binary *)0x0;
          }
        }
      }
    }
  }
  else {
    BVar4 = *(BinaryOp *)(type.id + 0x10);
    left = (Binary *)local_28.id;
    BVar3 = Abstract::getBinary(local_28,Ne);
    if (BVar4 == BVar3) goto LAB_01f8b40a;
  }
  TVar1.id = type.id;
  local_e8._16_8_ = Match::any();
  local_e8._0_8_ = Match::any();
  pMVar9 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
            *)local_e8;
  Match::
  binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>>
            ((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
              *)(local_e8 + 0x20),(Match *)&local_78,(Binary **)0x4,(int)local_e8 + Or,
             (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)pMVar9,
             (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)in_R9);
  Match::ival(&local_130,0);
  Match::
  binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>>
            (&local_a0,(Match *)0x1b,(int)local_e8 + 0x20,
             (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
              *)&local_130,pMVar9);
  matcher.data = local_a0.data;
  matcher._12_4_ = local_a0._12_4_;
  matcher.binder = local_a0.binder;
  matcher.submatchers.curr = local_a0.submatchers.curr;
  matcher.submatchers.next.curr = local_a0.submatchers.next.curr;
  matcher.submatchers.next._8_8_ = local_a0.submatchers.next._8_8_;
  bVar2 = Match::
          matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                    ((Expression *)TVar1.id,matcher);
  TVar1 = type;
  if (bVar2) {
    local_138 = local_28.id;
    BVar4 = Abstract::getBinary(local_28,Ne);
    *(BinaryOp *)(type.id + 0x10) = BVar4;
    *(undefined8 *)(type.id + 0x20) = *(undefined8 *)(local_78 + 0x20);
    *(undefined8 *)(type.id + 0x18) = *(undefined8 *)(local_78 + 0x18);
    return (Expression *)(OptimizeInstructions *)type.id;
  }
  local_1a8._16_8_ = Match::any();
  local_1a8._0_8_ = Match::any();
  pMVar9 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
            *)local_1a8;
  Match::
  binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>>
            ((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
              *)(local_1a8 + 0x20),(Match *)&local_78,(Binary **)0x4,(int)local_1a8 + Or,
             (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)pMVar9,
             (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)in_R9);
  Match::ival(&local_1f0,0);
  Match::
  binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>>
            (&local_160,(Match *)0x19,(int)local_1a8 + 0x20,
             (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
              *)&local_1f0,pMVar9);
  matcher_00.data = local_160.data;
  matcher_00._12_4_ = local_160._12_4_;
  matcher_00.binder = local_160.binder;
  matcher_00.submatchers.curr = local_160.submatchers.curr;
  matcher_00.submatchers.next.curr = local_160.submatchers.next.curr;
  matcher_00.submatchers.next._8_8_ = local_160.submatchers.next._8_8_;
  bVar2 = Match::
          matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                    ((Expression *)TVar1.id,matcher_00);
  TVar1 = type;
  if (bVar2) {
    local_1f8 = local_28.id;
    BVar4 = Abstract::getBinary(local_28,Eq);
    *(BinaryOp *)(type.id + 0x10) = BVar4;
    *(undefined8 *)(type.id + 0x20) = *(undefined8 *)(local_78 + 0x20);
    *(undefined8 *)(type.id + 0x18) = *(undefined8 *)(local_78 + 0x18);
    return (Expression *)(OptimizeInstructions *)type.id;
  }
  local_268._16_8_ = Match::any();
  local_268._0_8_ = Match::any();
  pMVar9 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
            *)local_268;
  Match::
  binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>>
            ((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
              *)(local_268 + 0x20),(Match *)&local_78,(Binary **)0x4,(int)local_268 + Or,
             (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)pMVar9,
             (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)in_R9);
  Match::ival(&local_2b0,0);
  Match::
  binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>>
            (&local_220,(Match *)0x14,(int)local_268 + 0x20,
             (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
              *)&local_2b0,pMVar9);
  matcher_01.data = local_220.data;
  matcher_01._12_4_ = local_220._12_4_;
  matcher_01.binder = local_220.binder;
  matcher_01.submatchers.curr = local_220.submatchers.curr;
  matcher_01.submatchers.next.curr = local_220.submatchers.next.curr;
  matcher_01.submatchers.next._8_8_ = local_220.submatchers.next._8_8_;
  bVar2 = Match::
          matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                    ((Expression *)TVar1.id,matcher_01);
  TVar1 = type;
  local_729 = true;
  if (!bVar2) {
    local_320._16_8_ = Match::any();
    local_320._0_8_ = Match::any();
    pMVar9 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
              *)local_320;
    Match::
    binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>>
              ((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
                *)(local_320 + 0x20),(Match *)&local_78,(Binary **)0x4,(int)local_320 + Or,
               (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)pMVar9,
               (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)in_R9);
    Match::ival((Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                 *)&add,0);
    Match::
    binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>>
              (&local_2d8,(Match *)0x15,(int)local_320 + 0x20,
               (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
                *)&add,pMVar9);
    matcher_02.data = local_2d8.data;
    matcher_02._12_4_ = local_2d8._12_4_;
    matcher_02.binder = local_2d8.binder;
    matcher_02.submatchers.curr = local_2d8.submatchers.curr;
    matcher_02.submatchers.next.curr = local_2d8.submatchers.next.curr;
    matcher_02.submatchers.next._8_8_ = local_2d8.submatchers.next._8_8_;
    local_729 = Match::
                matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                          ((Expression *)TVar1.id,matcher_02);
  }
  TVar1.id = type.id;
  if (local_729 != false) {
    *(undefined8 *)(type.id + 0x20) = *(undefined8 *)(local_78 + 0x20);
    *(undefined8 *)(type.id + 0x18) = *(undefined8 *)(local_78 + 0x18);
    return (Expression *)(OptimizeInstructions *)type.id;
  }
  local_3f0._0_8_ = Match::any();
  Match::ival(&local_430,&c2);
  s2 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
        *)local_3f0;
  Match::
  binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>>
            ((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
              *)(local_3f0 + 0x10),(Match *)&c1,(Binary **)0x3,(Op)s2,
             (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&local_430,in_R9);
  Match::ival((Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
               *)&C1.type,&local_380);
  Match::
  binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>>
            (&local_3b8,(Match *)(local_3f0 + 0x10),
             (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
              *)&C1.type,s2);
  matcher_03._8_8_ = local_3b8._8_8_;
  matcher_03.binder = local_3b8.binder;
  matcher_03.submatchers.curr.binder = local_3b8.submatchers.curr.binder;
  matcher_03.submatchers.curr._8_8_ = local_3b8.submatchers.curr._8_8_;
  matcher_03.submatchers.next.curr = local_3b8.submatchers.next.curr;
  matcher_03.submatchers.next.next.curr = local_3b8.submatchers.next.next.curr;
  matcher_03.submatchers.next.next._8_8_ = local_3b8.submatchers.next.next._8_8_;
  bVar2 = Match::
          matches<wasm::Match::Internal::Matcher<wasm::Binary*,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>>,wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>>
                    ((Expression *)TVar1.id,matcher_03);
  binary = c1;
  local_741 = 0;
  if (bVar2) {
    bVar2 = isSignedOp(*(BinaryOp *)(type.id + 0x10));
    bVar2 = canOverflow(this,(Binary *)binary,bVar2);
    local_741 = bVar2 ^ 0xff;
  }
  if ((local_741 & 1) != 0) {
    wasm::Literal::Literal((Literal *)&C2.type,&c2->value);
    wasm::Literal::Literal((Literal *)local_4a0,&local_380->value);
    wasm::Literal::sub((Literal *)&C2SubC1.type,(Literal *)&C2.type,(Literal *)local_4a0);
    wasm::Literal::sub((Literal *)&zero.type,(Literal *)local_4a0,(Literal *)&C2.type);
    TStack_500.id =
         (c1->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type.id;
    wasm::Literal::makeZero((Literal *)local_4f8,TStack_500);
    local_501 = 0;
    local_502 = 0;
    bVar2 = wasm::Literal::operator!=((Literal *)&C2.type,(Literal *)local_4f8);
    if ((bVar2) &&
       (bVar2 = wasm::Literal::operator!=((Literal *)local_4a0,(Literal *)local_4f8), bVar2)) {
      bVar2 = isSignedOp(*(BinaryOp *)(type.id + 0x10));
      if (bVar2) {
        local_539 = 0;
        wasm::Literal::leS(&local_520,(Literal *)&zero.type,(Literal *)local_4a0);
        iVar8 = wasm::Literal::getInteger(&local_520);
        bVar2 = false;
        if (iVar8 != 0) {
          wasm::Literal::leS(&local_538,(Literal *)local_4f8,(Literal *)&C2.type);
          local_539 = 1;
          iVar8 = wasm::Literal::getInteger(&local_538);
          bVar2 = iVar8 != 0;
        }
        if ((local_539 & 1) != 0) {
          wasm::Literal::~Literal(&local_538);
        }
        wasm::Literal::~Literal(&local_520);
        if (bVar2) {
          local_502 = 1;
        }
        else {
          local_571 = 0;
          wasm::Literal::leS(&local_558,(Literal *)&C2SubC1.type,(Literal *)&C2.type);
          iVar8 = wasm::Literal::getInteger(&local_558);
          bVar2 = false;
          if (iVar8 != 0) {
            wasm::Literal::leS(&local_570,(Literal *)local_4f8,(Literal *)local_4a0);
            local_571 = 1;
            iVar8 = wasm::Literal::getInteger(&local_570);
            bVar2 = iVar8 != 0;
          }
          if ((local_571 & 1) != 0) {
            wasm::Literal::~Literal(&local_570);
          }
          wasm::Literal::~Literal(&local_558);
          if (bVar2) {
            local_501 = 1;
          }
        }
      }
      else {
        local_5a9 = 0;
        wasm::Literal::leU(&local_590,(Literal *)&zero.type,(Literal *)local_4a0);
        iVar8 = wasm::Literal::getInteger(&local_590);
        bVar2 = false;
        if (iVar8 != 0) {
          wasm::Literal::leU(&local_5a8,(Literal *)local_4f8,(Literal *)&C2.type);
          local_5a9 = 1;
          iVar8 = wasm::Literal::getInteger(&local_5a8);
          bVar2 = iVar8 != 0;
        }
        if ((local_5a9 & 1) != 0) {
          wasm::Literal::~Literal(&local_5a8);
        }
        wasm::Literal::~Literal(&local_590);
        if (bVar2) {
          local_502 = 1;
        }
        else {
          wasm::Literal::leU(&local_5c8,(Literal *)&C2SubC1.type,(Literal *)&C2.type);
          iVar8 = wasm::Literal::getInteger(&local_5c8);
          bVar2 = false;
          if (iVar8 != 0) {
            wasm::Literal::leU(&local_5e0,(Literal *)local_4f8,(Literal *)local_4a0);
            iVar8 = wasm::Literal::getInteger(&local_5e0);
            bVar2 = iVar8 != 0;
            wasm::Literal::~Literal(&local_5e0);
          }
          wasm::Literal::~Literal(&local_5c8);
          if (bVar2) {
            local_501 = 1;
          }
        }
        local_7da = 1;
        if ((local_502 & 1) == 0) {
          local_7da = local_501;
        }
        if ((local_7da & 1) == 0) {
          __assert_fail("doC2SubC1 || doC1SubC2",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/OptimizeInstructions.cpp"
                        ,0x1232,
                        "Expression *wasm::OptimizeInstructions::optimizeRelational(Binary *)");
        }
      }
    }
    if ((local_502 & 1) == 0) {
      if ((local_501 & 1) == 0) {
        bVar2 = false;
      }
      else {
        wasm::Literal::operator=(&c2->value,(Literal *)&C2SubC1.type);
        wasm::Literal::operator=(&local_380->value,(Literal *)local_4f8);
        this_local = (OptimizeInstructions *)type.id;
        bVar2 = true;
      }
    }
    else {
      wasm::Literal::operator=(&local_380->value,(Literal *)&zero.type);
      *(char **)(type.id + 0x18) = (c1->value).field_0.func.super_IString.str._M_str;
      this_local = (OptimizeInstructions *)type.id;
      bVar2 = true;
    }
    wasm::Literal::~Literal((Literal *)local_4f8);
    wasm::Literal::~Literal((Literal *)&zero.type);
    wasm::Literal::~Literal((Literal *)&C2SubC1.type);
    wasm::Literal::~Literal((Literal *)local_4a0);
    wasm::Literal::~Literal((Literal *)&C2.type);
    if (bVar2) {
      return (Expression *)this_local;
    }
  }
  IVar5 = Bits::getMaxBits<wasm::OptimizeInstructions>(*(Expression **)(type.id + 0x18),this);
  TStack_600.id = *(uintptr_t *)(*(long *)(type.id + 0x18) + 8);
  local_5f8.id = TStack_600.id;
  type_1.id._4_4_ = IVar5;
  IVar6 = getBitsForType(TStack_600);
  if (IVar5 < IVar6) {
    IVar5 = Bits::getMinBits(*(Expression **)(type.id + 0x20));
    local_610 = local_5f8.id;
    local_604 = IVar5;
    IVar6 = getBitsForType(local_5f8);
    local_605 = IVar5 == IVar6;
    if (type_1.id._4_4_ < local_604) {
      BVar4 = *(BinaryOp *)(type.id + 0x10);
      local_618 = local_5f8.id;
      BVar3 = Abstract::getBinary(local_5f8,Eq);
      if (BVar4 != BVar3) {
        BVar4 = *(BinaryOp *)(type.id + 0x10);
        local_620 = local_5f8.id;
        BVar3 = Abstract::getBinary(local_5f8,GtU);
        if (BVar4 != BVar3) {
          BVar4 = *(BinaryOp *)(type.id + 0x10);
          local_628 = local_5f8.id;
          BVar3 = Abstract::getBinary(local_5f8,GeU);
          if (BVar4 != BVar3) {
            if ((local_605 & 1) == 0) {
              BVar4 = *(BinaryOp *)(type.id + 0x10);
              local_630 = local_5f8.id;
              BVar3 = Abstract::getBinary(local_5f8,GtS);
              if (BVar4 == BVar3) goto LAB_01f8c3ab;
              BVar4 = *(BinaryOp *)(type.id + 0x10);
              local_638 = local_5f8.id;
              BVar3 = Abstract::getBinary(local_5f8,GeS);
              if (BVar4 == BVar3) goto LAB_01f8c3ab;
            }
            BVar4 = *(BinaryOp *)(type.id + 0x10);
            local_660 = local_5f8.id;
            BVar3 = Abstract::getBinary(local_5f8,Ne);
            if (BVar4 != BVar3) {
              BVar4 = *(BinaryOp *)(type.id + 0x10);
              local_668 = local_5f8.id;
              BVar3 = Abstract::getBinary(local_5f8,LtU);
              if (BVar4 != BVar3) {
                BVar4 = *(BinaryOp *)(type.id + 0x10);
                local_670 = local_5f8.id;
                BVar3 = Abstract::getBinary(local_5f8,LeU);
                if (BVar4 != BVar3) {
                  if ((local_605 & 1) != 0) {
LAB_01f8c610:
                    if ((local_605 & 1) == 0) {
                      return (Expression *)(OptimizeInstructions *)0x0;
                    }
                    BVar4 = *(BinaryOp *)(type.id + 0x10);
                    local_6a8 = local_5f8.id;
                    BVar3 = Abstract::getBinary(local_5f8,GtS);
                    if (BVar4 != BVar3) {
                      BVar4 = *(BinaryOp *)(type.id + 0x10);
                      local_6b0 = local_5f8.id;
                      BVar3 = Abstract::getBinary(local_5f8,GeS);
                      if (BVar4 != BVar3) {
                        BVar4 = *(BinaryOp *)(type.id + 0x10);
                        local_6d8 = local_5f8.id;
                        BVar3 = Abstract::getBinary(local_5f8,LtS);
                        if (BVar4 != BVar3) {
                          BVar4 = *(BinaryOp *)(type.id + 0x10);
                          local_6e0 = local_5f8.id;
                          BVar3 = Abstract::getBinary(local_5f8,LeS);
                          if (BVar4 != BVar3) {
                            return (Expression *)(OptimizeInstructions *)0x0;
                          }
                        }
                        TVar1.id = type.id;
                        wasm::Type::Type(&local_700,i32);
                        wasm::Literal::makeZero(&local_6f8,local_700);
                        pOVar7 = (OptimizeInstructions *)
                                 getDroppedChildrenAndAppend(this,(Expression *)TVar1.id,&local_6f8)
                        ;
                        wasm::Literal::~Literal(&local_6f8);
                        return (Expression *)pOVar7;
                      }
                    }
                    TVar1.id = type.id;
                    wasm::Type::Type(&local_6d0,i32);
                    wasm::Literal::makeOne(&local_6c8,local_6d0);
                    pOVar7 = (OptimizeInstructions *)
                             getDroppedChildrenAndAppend(this,(Expression *)TVar1.id,&local_6c8);
                    wasm::Literal::~Literal(&local_6c8);
                    return (Expression *)pOVar7;
                  }
                  BVar4 = *(BinaryOp *)(type.id + 0x10);
                  local_678 = local_5f8.id;
                  BVar3 = Abstract::getBinary(local_5f8,LtS);
                  if (BVar4 != BVar3) {
                    BVar4 = *(BinaryOp *)(type.id + 0x10);
                    local_680 = local_5f8.id;
                    BVar3 = Abstract::getBinary(local_5f8,LeS);
                    if (BVar4 != BVar3) goto LAB_01f8c610;
                  }
                }
              }
            }
            TVar1.id = type.id;
            wasm::Type::Type(&local_6a0,i32);
            wasm::Literal::makeOne(&local_698,local_6a0);
            pOVar7 = (OptimizeInstructions *)
                     getDroppedChildrenAndAppend(this,(Expression *)TVar1.id,&local_698);
            wasm::Literal::~Literal(&local_698);
            return (Expression *)pOVar7;
          }
        }
      }
LAB_01f8c3ab:
      TVar1.id = type.id;
      wasm::Type::Type(&local_658,i32);
      wasm::Literal::makeZero(&local_650,local_658);
      pOVar7 = (OptimizeInstructions *)
               getDroppedChildrenAndAppend(this,(Expression *)TVar1.id,&local_650);
      wasm::Literal::~Literal(&local_650);
      return (Expression *)pOVar7;
    }
  }
  return (Expression *)(OptimizeInstructions *)0x0;
}

Assistant:

Expression* optimizeRelational(Binary* curr) {
    using namespace Abstract;
    using namespace Match;

    auto type = curr->right->type;
    if (curr->left->type.isInteger()) {
      if (curr->op == Abstract::getBinary(type, Abstract::Eq) ||
          curr->op == Abstract::getBinary(type, Abstract::Ne)) {
        if (auto* left = curr->left->dynCast<Binary>()) {
          // TODO: inequalities can also work, if the constants do not overflow
          // integer math, even on 2s complement, allows stuff like
          // x + 5 == 7
          //   =>
          //     x == 2
          if (left->op == Abstract::getBinary(type, Abstract::Add)) {
            if (auto* leftConst = left->right->dynCast<Const>()) {
              if (auto* rightConst = curr->right->dynCast<Const>()) {
                return combineRelationalConstants(
                  curr, left, leftConst, nullptr, rightConst);
              } else if (auto* rightBinary = curr->right->dynCast<Binary>()) {
                if (rightBinary->op ==
                    Abstract::getBinary(type, Abstract::Add)) {
                  if (auto* rightConst = rightBinary->right->dynCast<Const>()) {
                    return combineRelationalConstants(
                      curr, left, leftConst, rightBinary, rightConst);
                  }
                }
              }
            }
          }
        }
      }
      // x - y == 0  =>  x == y
      // x - y != 0  =>  x != y
      // unsigned(x - y) > 0    =>   x != y
      // unsigned(x - y) <= 0   =>   x == y
      {
        Binary* inner;
        // unsigned(x - y) > 0    =>   x != y
        if (matches(curr,
                    binary(GtU, binary(&inner, Sub, any(), any()), ival(0)))) {
          curr->op = Abstract::getBinary(type, Ne);
          curr->right = inner->right;
          curr->left = inner->left;
          return curr;
        }
        // unsigned(x - y) <= 0   =>   x == y
        if (matches(curr,
                    binary(LeU, binary(&inner, Sub, any(), any()), ival(0)))) {
          curr->op = Abstract::getBinary(type, Eq);
          curr->right = inner->right;
          curr->left = inner->left;
          return curr;
        }
        // x - y == 0  =>  x == y
        // x - y != 0  =>  x != y
        // This is not true for signed comparisons like x -y < 0 due to overflow
        // effects (e.g. 8 - 0x80000000 < 0 is not the same as 8 < 0x80000000).
        if (matches(curr,
                    binary(Eq, binary(&inner, Sub, any(), any()), ival(0))) ||
            matches(curr,
                    binary(Ne, binary(&inner, Sub, any(), any()), ival(0)))) {
          curr->right = inner->right;
          curr->left = inner->left;
          return curr;
        }
      }

      // x + C1 > C2   ==>  x > (C2-C1)      if no overflowing, C2 >= C1
      // x + C1 > C2   ==>  x + (C1-C2) > 0  if no overflowing, C2 <  C1
      // And similarly for other relational operations on integers with a "+"
      // on the left.
      // TODO: support - and not just +
      {
        Binary* add;
        Const* c1;
        Const* c2;
        if (matches(curr,
                    binary(binary(&add, Add, any(), ival(&c1)), ival(&c2))) &&
            !canOverflow(add, isSignedOp(curr->op))) {
          // We want to subtract C2-C1 or C1-C2. When doing so, we must avoid an
          // overflow in that subtraction (so that we keep all the math here
          // properly linear in the mathematical sense). Overflows that concern
          // us include an underflow with unsigned values (e.g. 10 - 20, which
          // flips the result to a large positive number), and a sign bit
          // overflow for signed values (e.g. 0x80000000 - 1 = 0x7fffffff flips
          // from a negative number, -1, to a positive one). We also need to be
          // careful of signed handling of 0x80000000, for whom 0 - 0x80000000
          // is equal to 0x80000000, leading to
          //   x + 0x80000000 > 0                ;; always false
          // (apply the rule)
          //   x > 0 - 0x80000000 = 0x80000000   ;; depends on x
          // The general principle in all of this is that when we go from
          //   (a)    x + C1 > C2
          // to
          //   (b)    x      > (C2-C1)
          // then we want to adjust both sides in the same (linear) manner. That
          // is, we can write the latter as
          //   (b')   x + 0  > (C2-C1)
          // Comparing (a) and (b'), we want the constants to change in a
          // consistent way: C1 changes to 0, and C2 changes to C2-C1. Both
          // transformations should decrease the value, which is violated in all
          // the overflows described above:
          //   * Unsigned overflow: C1=20, C2=10, then C1 decreases but C2-C1
          //     is larger than C2.
          //   * Sign flip: C1=1, C2=0x80000000, then C1 decreases but C2-C1 is
          //     is larger than C2.
          //   * C1=0x80000000, C2=0, then C1 increases while C2-C1 stays the
          //     same.
          // In the first and second case we can apply the other rule using
          // C1-C2 rather than C2-C1. The third case, however, doesn't even work
          // that way.
          auto C1 = c1->value;
          auto C2 = c2->value;
          auto C1SubC2 = C1.sub(C2);
          auto C2SubC1 = C2.sub(C1);
          auto zero = Literal::makeZero(add->type);
          auto doC1SubC2 = false;
          auto doC2SubC1 = false;
          // Ignore the case of C1 or C2 being zero, as then C2-C1 or C1-C2
          // does not change anything (and we don't want the optimizer to think
          // we improved anything, or we could infinite loop on the mirage of
          // progress).
          if (C1 != zero && C2 != zero) {
            if (isSignedOp(curr->op)) {
              if (C2SubC1.leS(C2).getInteger() && zero.leS(C1).getInteger()) {
                // C2=>C2-C1 and C1=>0 both decrease, which means we can do the
                // rule
                //   (a)    x + C1   > C2
                //   (b')   x (+ 0)  > (C2-C1)
                // That is, subtracting C1 from both sides is ok; the constants
                // on both sides change in the same manner.
                doC2SubC1 = true;
              } else if (C1SubC2.leS(C1).getInteger() &&
                         zero.leS(C2).getInteger()) {
                // N.B. this code path is not tested atm as other optimizations
                // will canonicalize x + C into x - C, and so we would need to
                // implement the TODO above on subtraction and not only support
                // addition here.
                doC1SubC2 = true;
              }
            } else {
              // Unsigned.
              if (C2SubC1.leU(C2).getInteger() && zero.leU(C1).getInteger()) {
                doC2SubC1 = true;
              } else if (C1SubC2.leU(C1).getInteger() &&
                         zero.leU(C2).getInteger()) {
                doC1SubC2 = true;
              }
              // For unsigned, one of the cases must work out, as there are no
              // corner cases with the sign bit.
              assert(doC2SubC1 || doC1SubC2);
            }
          }
          if (doC2SubC1) {
            // This is the first line above, we turn into x > (C2-C1).
            c2->value = C2SubC1;
            curr->left = add->left;
            return curr;
          }
          // This is the second line above, we turn into x + (C1-C2) > 0.
          if (doC1SubC2) {
            c1->value = C1SubC2;
            c2->value = zero;
            return curr;
          }
        }
      }

      // Comparisons can sometimes be simplified depending on the number of
      // bits, e.g.  (unsigned)x > y  must be true if x has strictly more bits.
      // A common case is a constant on the right, e.g. (x & 255) < 256 must be
      // true.
      // TODO: use getMinBits in more places, see ideas in
      //       https://github.com/WebAssembly/binaryen/issues/2898
      {
        // Check if there is a nontrivial amount of bits on the left, which may
        // provide enough to optimize.
        auto leftMaxBits = Bits::getMaxBits(curr->left, this);
        auto type = curr->left->type;
        if (leftMaxBits < getBitsForType(type)) {
          using namespace Abstract;
          auto rightMinBits = Bits::getMinBits(curr->right);
          auto rightIsNegative = rightMinBits == getBitsForType(type);
          if (leftMaxBits < rightMinBits) {
            // There are not enough bits on the left for it to be equal to the
            // right, making various comparisons obviously false:
            //             x == y
            //   (unsigned)x >  y
            //   (unsigned)x >= y
            // and the same for signed, if y does not have the sign bit set
            // (in that case, the comparison is effectively unsigned).
            //
            // TODO: In addition to leftMaxBits < rightMinBits, we could
            //       handle the reverse, and also special cases like all bits
            //       being 1 on the right, things like (x & 255) <= 255  ->  1
            if (curr->op == Abstract::getBinary(type, Eq) ||
                curr->op == Abstract::getBinary(type, GtU) ||
                curr->op == Abstract::getBinary(type, GeU) ||
                (!rightIsNegative &&
                 (curr->op == Abstract::getBinary(type, GtS) ||
                  curr->op == Abstract::getBinary(type, GeS)))) {
              return getDroppedChildrenAndAppend(curr,
                                                 Literal::makeZero(Type::i32));
            }

            // And some are obviously true:
            //             x != y
            //   (unsigned)x <  y
            //   (unsigned)x <= y
            // and likewise for signed, as above.
            if (curr->op == Abstract::getBinary(type, Ne) ||
                curr->op == Abstract::getBinary(type, LtU) ||
                curr->op == Abstract::getBinary(type, LeU) ||
                (!rightIsNegative &&
                 (curr->op == Abstract::getBinary(type, LtS) ||
                  curr->op == Abstract::getBinary(type, LeS)))) {
              return getDroppedChildrenAndAppend(curr,
                                                 Literal::makeOne(Type::i32));
            }

            // For truly signed comparisons, where y's sign bit is set, we can
            // also infer some things, since we know y is signed but x is not
            // (since x does not have enough bits for the sign bit to be set).
            if (rightIsNegative) {
              //   (signed, non-negative)x >  (negative)y   =>   1
              //   (signed, non-negative)x >= (negative)y   =>   1
              if (curr->op == Abstract::getBinary(type, GtS) ||
                  curr->op == Abstract::getBinary(type, GeS)) {
                return getDroppedChildrenAndAppend(curr,
                                                   Literal::makeOne(Type::i32));
              }
              //   (signed, non-negative)x <  (negative)y   =>   0
              //   (signed, non-negative)x <= (negative)y   =>   0
              if (curr->op == Abstract::getBinary(type, LtS) ||
                  curr->op == Abstract::getBinary(type, LeS)) {
                return getDroppedChildrenAndAppend(
                  curr, Literal::makeZero(Type::i32));
              }
            }
          }
        }
      }
    }
    return nullptr;
  }